

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O1

int CVodeSetErrHandlerFn(void *cvode_mem,CVErrHandlerFn ehfun,void *eh_data)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetErrHandlerFn","cvode_mem = NULL illegal.");
  }
  else {
    *(CVErrHandlerFn *)((long)cvode_mem + 0x470) = ehfun;
    *(void **)((long)cvode_mem + 0x478) = eh_data;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetErrHandlerFn(void *cvode_mem, CVErrHandlerFn ehfun, void *eh_data)
{
  CVodeMem cv_mem;

  if (cvode_mem==NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetErrHandlerFn", MSGCV_NO_MEM);
    return(CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  cv_mem->cv_ehfun = ehfun;
  cv_mem->cv_eh_data = eh_data;

  return(CV_SUCCESS);
}